

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_quat.cpp
# Opt level: O1

quaternion operator*(quaternion *in_quat,float scalar)

{
  quaternion qVar1;
  
  qVar1.field_0 = scalar * (in_quat->field_0).w;
  qVar1.field_1._0_4_ = scalar * (in_quat->field_1).dual.x;
  qVar1.field_1.dual.z = scalar * (in_quat->field_1).dual.z;
  qVar1.field_1.dual.y = scalar * (in_quat->field_1).dual.y;
  return qVar1;
}

Assistant:

quaternion operator*(const quaternion &in_quat, const float scalar) {
    quaternion temp = {0.f};

    temp.w = in_quat.q0 * scalar;
    temp.q1 = in_quat.q1 * scalar;
    temp.q2 = in_quat.q2 * scalar;
    temp.q3 = in_quat.q3 * scalar;

    return temp;
}